

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O1

void cppcms::impl::md5_finish(md5_state_t *pms,md5_byte_t *digest)

{
  byte bVar1;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  md5_byte_t data [8];
  md5_byte_t local_18 [8];
  byte bVar2;
  byte bVar3;
  
  iVar10 = 0;
  iVar11 = 1;
  iVar12 = 2;
  iVar13 = 3;
  lVar9 = 0;
  do {
    uVar14 = *(uint *)((long)pms->count + lVar9);
    auVar15._0_4_ = iVar10 << 3;
    auVar15._4_4_ = iVar11 << 3;
    auVar15._8_4_ = iVar12 << 3;
    auVar15._12_4_ = iVar13 << 3;
    auVar15 = auVar15 & _DAT_002479a0;
    auVar16 = pshuflw(in_XMM6,auVar15,0xfe);
    uVar18 = uVar14 >> auVar16._0_8_;
    auVar17 = pshuflw(auVar16,auVar15,0x54);
    uVar20 = uVar14 >> auVar17._0_8_;
    auVar16._8_4_ = auVar15._8_4_;
    auVar16._12_4_ = auVar15._12_4_;
    auVar16._0_8_ = auVar15._8_8_;
    in_XMM6 = pshuflw(auVar17,auVar16,0xfe);
    uVar19 = uVar14 >> in_XMM6._0_8_;
    auVar15 = pshuflw(auVar16,auVar16,0x54);
    uVar14 = uVar14 >> auVar15._0_8_;
    uVar4 = (ushort)uVar20 & 0xff;
    uVar5 = (ushort)uVar18 & 0xff;
    uVar6 = (ushort)uVar14 & 0xff;
    uVar7 = (ushort)uVar19 & 0xff;
    bVar8 = ((uVar20 & 0xff) != 0) * (uVar4 < 0x100) * (char)uVar20 - (0xff < uVar4);
    bVar1 = ((uVar18 & 0xff) != 0) * (uVar5 < 0x100) * (char)uVar18 - (0xff < uVar5);
    bVar2 = ((uVar14 & 0xff) != 0) * (uVar6 < 0x100) * (char)uVar14 - (0xff < uVar6);
    bVar3 = ((uVar19 & 0xff) != 0) * (uVar7 < 0x100) * (char)uVar19 - (0xff < uVar7);
    *(uint *)(local_18 + lVar9) =
         CONCAT13((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                  CONCAT12((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                           CONCAT11((bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1),
                                    (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8))));
    lVar9 = lVar9 + 4;
    iVar10 = iVar10 + 4;
    iVar11 = iVar11 + 4;
    iVar12 = iVar12 + 4;
    iVar13 = iVar13 + 4;
  } while (lVar9 != 8);
  md5_append(pms,md5_finish::pad,(0x37 - (pms->count[0] >> 3) & 0x3f) + 1);
  md5_append(pms,local_18,8);
  bVar8 = 0;
  lVar9 = 0;
  do {
    digest[lVar9] =
         (md5_byte_t)
         (*(uint *)((long)pms->abcd + (ulong)((uint)lVar9 & 0xfffffffc)) >> (bVar8 & 0x18));
    lVar9 = lVar9 + 1;
    bVar8 = bVar8 + 8;
  } while (lVar9 != 0x10);
  return;
}

Assistant:

void
md5_finish(md5_state_t *pms, md5_byte_t digest[16])
{
    static const md5_byte_t pad[64] = {
	0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
    };
    md5_byte_t data[8];
    int i;

    /* Save the length before padding. */
    for (i = 0; i < 8; ++i)
	data[i] = (md5_byte_t)(pms->count[i >> 2] >> ((i & 3) << 3));
    /* Pad to 56 bytes mod 64. */
    md5_append(pms, pad, ((55 - (pms->count[0] >> 3)) & 63) + 1);
    /* Append the length. */
    md5_append(pms, data, 8);
    for (i = 0; i < 16; ++i)
	digest[i] = (md5_byte_t)(pms->abcd[i >> 2] >> ((i & 3) << 3));
}